

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O3

bool absl::lts_20250127::str_format_internal::FormatArgImpl::
     Dispatch<absl::lts_20250127::str_format_internal::VoidPtr>
               (Data arg,FormatConversionSpecImpl spec,void *out)

{
  ulong uVar1;
  FormatSinkImpl *in_R8;
  FormatConversionSpecImpl conv;
  
  conv.precision_ = (int)out;
  conv.width_ = (undefined4)((ulong)register0x00000010 >> 0x20);
  conv._0_4_ = spec.precision_;
  uVar1 = spec._0_8_ & 0xff;
  if (uVar1 == 0x11) {
    str_format_internal::FormatConvertImpl
              ((str_format_internal *)arg.ptr,(VoidPtr)spec._0_8_,conv,in_R8);
  }
  return (int)uVar1 == 0x11;
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }